

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-x509.c
# Opt level: O0

int lws_x509_verify(lws_x509_cert *x509,lws_x509_cert *trusted,char *common_name)

{
  int iVar1;
  X509_NAME *a;
  char *pcVar2;
  X509_NAME *xn;
  char **ppcStack_50;
  int ret;
  char *p;
  char c [32];
  char *common_name_local;
  lws_x509_cert *trusted_local;
  lws_x509_cert *x509_local;
  
  c._24_8_ = common_name;
  if (common_name != (char *)0x0) {
    a = X509_get_subject_name((X509 *)x509->cert);
    if (a == (X509_NAME *)0x0) {
      return -1;
    }
    X509_NAME_oneline(a,(char *)&p,0x1e);
    pcVar2 = strstr((char *)&p,"/CN=");
    if (pcVar2 == (char *)0x0) {
      ppcStack_50 = &p;
    }
    else {
      ppcStack_50 = (char **)(pcVar2 + 4);
    }
    iVar1 = strcmp((char *)ppcStack_50,(char *)c._24_8_);
    if (iVar1 != 0) {
      _lws_log(1,"%s: common name mismatch\n","lws_x509_verify");
      return -1;
    }
  }
  iVar1 = X509_check_issued((X509 *)trusted->cert,(X509 *)x509->cert);
  if (iVar1 == 0) {
    x509_local._4_4_ = 0;
  }
  else {
    _lws_log(1,"%s: unable to verify cert relationship\n","lws_x509_verify");
    lws_tls_err_describe_clear();
    x509_local._4_4_ = -1;
  }
  return x509_local._4_4_;
}

Assistant:

int
lws_x509_verify(struct lws_x509_cert *x509, struct lws_x509_cert *trusted,
		const char *common_name)
{
	char c[32], *p;
	int ret;

	if (common_name) {
		X509_NAME *xn = X509_get_subject_name(x509->cert);
		if (!xn)
			return -1;
		X509_NAME_oneline(xn, c, (int)sizeof(c) - 2);
		p = strstr(c, "/CN=");
		if (p)
			p = p + 4;
		else
			p = c;

		if (strcmp(p, common_name)) {
			lwsl_err("%s: common name mismatch\n", __func__);
			return -1;
		}
	}

	ret = X509_check_issued(trusted->cert, x509->cert);
	if (ret != X509_V_OK) {
		lwsl_err("%s: unable to verify cert relationship\n", __func__);
		lws_tls_err_describe_clear();

		return -1;
	}

	return 0;
}